

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<JumpCleanupInfo,_RealCount>::RemoveHead<Memory::ArenaAllocator>
          (DListBase<JumpCleanupInfo,_RealCount> *this,ArenaAllocator *allocator)

{
  DListNodeBase<JumpCleanupInfo> *pDVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DListNode<JumpCleanupInfo> *obj;
  
  obj = (this->super_DListNodeBase<JumpCleanupInfo>).next.node;
  if (obj == (DListNode<JumpCleanupInfo> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x158,"(!this->Empty())","!this->Empty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    obj = (this->super_DListNodeBase<JumpCleanupInfo>).next.node;
  }
  pDVar1 = (obj->super_DListNodeBase<JumpCleanupInfo>).next.base;
  (((obj->super_DListNodeBase<JumpCleanupInfo>).prev.base)->next).base = pDVar1;
  pDVar1->prev = (obj->super_DListNodeBase<JumpCleanupInfo>).prev;
  Memory::
  DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<JumpCleanupInfo>>
            (allocator,obj);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveHead(TAllocator * allocator)
    {
        Assert(!this->Empty());

        NodeBase * node = this->Next();
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, (Node *)node);

        this->DecrementCount();
    }